

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

cmpResult __thiscall llvm::APFloat::compare(APFloat *this,APFloat *RHS)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  cmpResult cVar5;
  Storage *rhs;
  Storage *this_00;
  
  if ((this->U).semantics != (RHS->U).semantics) {
    __assert_fail("&getSemantics() == &RHS.getSemantics() && \"Should only compare APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x450,"cmpResult llvm::APFloat::compare(const APFloat &) const");
  }
  this_00 = &this->U;
  rhs = &RHS->U;
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    if ((this_00->IEEE).semantics != (rhs->IEEE).semantics) {
      __assert_fail("semantics == rhs.semantics",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x740,
                    "IEEEFloat::cmpResult llvm::detail::IEEEFloat::compare(const IEEEFloat &) const"
                   );
    }
    bVar1 = *(byte *)((long)&this->U + 0x12);
    bVar2 = *(byte *)((long)&RHS->U + 0x12);
    switch((bVar2 & 7) + (bVar1 & 7) * 4) {
    case 0:
      uVar4 = bVar1 >> 3 & 1;
      if (SUB41(uVar4,0) != ((bVar2 >> 3 & 1) != 0)) {
        return uVar4 * 2 ^ cmpGreaterThan;
      }
    case 0xf:
      cVar5 = cmpEqual;
      break;
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 9:
    case 0xd:
      cVar5 = cmpUnordered;
      break;
    case 2:
    case 3:
    case 0xb:
      cVar5 = ~(uint)bVar1 >> 2 & cmpGreaterThan;
      break;
    case 8:
    case 0xc:
    case 0xe:
      cVar5 = bVar2 >> 2 & cmpGreaterThan;
      break;
    case 10:
      bVar3 = (bool)(bVar1 >> 3 & 1);
      if (bVar3 == ((bVar2 >> 3 & 1) != 0)) {
        cVar5 = detail::IEEEFloat::compareAbsoluteValue(&this_00->IEEE,&rhs->IEEE);
        if ((*(byte *)((long)&this->U + 0x12) & 8) != 0) {
          if (cVar5 == cmpLessThan) {
            cVar5 = cmpGreaterThan;
          }
          else if (cVar5 == cmpGreaterThan) {
            cVar5 = cmpLessThan;
          }
        }
      }
      else {
        cVar5 = (uint)(byte)(bVar3 * '\x02' ^ 2);
      }
      break;
    default:
      llvm_unreachable_internal
                ((char *)0x0,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0x744);
    }
    return cVar5;
  }
  cVar5 = detail::DoubleAPFloat::compare
                    ((DoubleAPFloat *)&this_00->IEEE,(DoubleAPFloat *)&rhs->IEEE);
  return cVar5;
}

Assistant:

const fltSemantics &getSemantics() const { return *U.semantics; }